

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void Curl_http2_setup_req(Curl_easy *data)

{
  HTTP *pHVar1;
  
  pHVar1 = (data->req).p.http;
  pHVar1->bodystarted = false;
  pHVar1->status_code = -1;
  pHVar1->closed = false;
  pHVar1->error = 0;
  pHVar1->pausedata = (uint8_t *)0x0;
  pHVar1->pauselen = 0;
  pHVar1->close_handled = false;
  pHVar1->mem = (char *)0x0;
  pHVar1->len = 0;
  pHVar1->memlen = 0;
  return;
}

Assistant:

void Curl_http2_setup_req(struct Curl_easy *data)
{
  struct HTTP *http = data->req.p.http;
  http->bodystarted = FALSE;
  http->status_code = -1;
  http->pausedata = NULL;
  http->pauselen = 0;
  http->closed = FALSE;
  http->close_handled = FALSE;
  http->mem = NULL;
  http->len = 0;
  http->memlen = 0;
  http->error = NGHTTP2_NO_ERROR;
}